

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O2

void parminstall(Symbol *n,char *num,char *units,char *limits)

{
  ulong uVar1;
  char *pcVar2;
  char buf [8192];
  char acStack_2028 [8192];
  
  uVar1 = n->subtype;
  previous_str = (n->u).str;
  previous_subtype = uVar1;
  if (previous_str == (char *)0x0) {
    lappendsym(syminorder,n);
    uVar1 = n->subtype;
  }
  n->subtype = uVar1 | 2;
  sprintf(acStack_2028,"\n%s\n%s\n%s\n",num,units,limits);
  pcVar2 = stralloc(acStack_2028,(char *)0x0);
  (n->u).str = pcVar2;
  return;
}

Assistant:

void parminstall(n, num, units, limits)
	Symbol         *n;
	char           *num, *units, *limits;
{
	char buf[NRN_BUFSIZE];

	previous_subtype = n->subtype;	
	previous_str = n->u.str;
	if (n->u.str == (char *) 0)
		Lappendsym(syminorder, n);
	n->subtype |= PARM;
	Sprintf(buf, "\n%s\n%s\n%s\n", num, units, limits);
	n->u.str = stralloc(buf, (char *) 0);
}